

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O1

int main(void)

{
  char *extension;
  int iVar1;
  uint uVar2;
  GLFWwindow *handle;
  long lVar3;
  char *pcVar4;
  GLint value;
  int height;
  int width;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    glfwWindowHint(0x20004,0);
    handle = glfwCreateWindow(0x280,0x1e0,"Defaults",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwGetFramebufferSize(handle,(int *)&local_34,(int *)&local_38);
      printf("framebuffer size: %ix%i\n",(ulong)local_34,(ulong)local_38);
      pcVar4 = "Context version major";
      lVar3 = 0;
      do {
        uVar2 = glfwGetWindowAttrib(handle,*(int *)((long)&glfw_attribs[0].attrib + lVar3));
        printf("%s: %i\n",pcVar4,(ulong)uVar2);
        pcVar4 = *(char **)((long)&glfw_attribs[1].name + lVar3);
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x50);
      pcVar4 = "red bits";
      lVar3 = 0;
      do {
        local_3c = 0;
        extension = *(char **)((long)&gl_attribs[0].ext + lVar3);
        if (extension == (char *)0x0) {
LAB_00106b7b:
          glGetIntegerv(*(undefined4 *)((long)&gl_attribs[0].attrib + lVar3),&local_3c);
          printf("%s: %i\n",pcVar4,(ulong)local_3c);
        }
        else {
          iVar1 = glfwExtensionSupported(extension);
          if (iVar1 != 0) goto LAB_00106b7b;
        }
        pcVar4 = *(char **)((long)&gl_attribs[1].name + lVar3);
        lVar3 = lVar3 + 0x18;
        if (lVar3 == 0xc0) {
          glfwDestroyWindow(handle);
          glfwTerminate();
          exit(0);
        }
      } while( true );
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i, width, height;
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    window = glfwCreateWindow(640, 480, "Defaults", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    glfwGetFramebufferSize(window, &width, &height);

    printf("framebuffer size: %ix%i\n", width, height);

    for (i = 0;  glfw_attribs[i].name;   i++)
    {
        printf("%s: %i\n",
               glfw_attribs[i].name,
               glfwGetWindowAttrib(window, glfw_attribs[i].attrib));
    }

    for (i = 0;  gl_attribs[i].name;   i++)
    {
        GLint value = 0;

        if (gl_attribs[i].ext)
        {
            if (!glfwExtensionSupported(gl_attribs[i].ext))
                continue;
        }

        glGetIntegerv(gl_attribs[i].attrib, &value);

        printf("%s: %i\n", gl_attribs[i].name, value);
    }

    glfwDestroyWindow(window);
    window = NULL;

    glfwTerminate();
    exit(EXIT_SUCCESS);
}